

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

int cmdParseScript(char *script,cmdScript_t *s,int diags)

{
  cmdInstr_t *pcVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  cmdCtlParse_t ctl;
  uintptr_t p [10];
  cmdTagStep_t tag_step [50];
  char v [65536];
  cmdCtlParse_t cStack_10228;
  char *pcStack_10220;
  uintptr_t uStack_10218;
  ulong uStack_10210;
  uintptr_t uStack_10208;
  size_t sStack_10200;
  char *pcStack_101f8;
  uint auStack_101c8 [100];
  char acStack_10038 [65544];
  
  cStack_10228.eaten = 0;
  sVar3 = strlen(script);
  iVar8 = (int)sVar3;
  piVar4 = (int *)calloc(1,(long)((int)((long)iVar8 * 0x30 + 0x60U >> 1) + iVar8 + 0x280));
  s->par = piVar4;
  if (piVar4 == (int *)0x0) {
    iVar6 = -1;
  }
  else {
    s->var = piVar4 + 10;
    s->instr = (cmdInstr_t *)(piVar4 + 0xa0);
    s->str_area = (char *)(piVar4 + (long)((iVar8 + 2) / 2) * 0xc + 0xa0);
    s->str_area_len = iVar8;
    iVar6 = 0;
    s->str_area_pos = 0;
    s->instrs = 0;
    if (0 < iVar8) {
      iVar6 = 0;
      uVar9 = 0;
      pcStack_10220 = script;
      do {
        iVar2 = cmdParse(script,&uStack_10218,0x10000,acStack_10038,&cStack_10228);
        sVar3 = sStack_10200;
        if (((iVar2 == -1) || (cmdInfo[intCmdIdx].cvis == 0)) || (iVar2 < 0)) {
          if (diags != 0) {
            cmdParseScript_cold_1();
          }
          if (iVar6 == 0) {
            iVar6 = -0x37;
          }
        }
        else {
          if (sStack_10200 != 0) {
            memcpy(s->str_area + s->str_area_pos,acStack_10038,sStack_10200);
            s->str_area[(long)s->str_area_pos + sVar3] = '\0';
            pcStack_101f8 = s->str_area + s->str_area_pos;
            s->str_area_pos = s->str_area_pos + (int)sVar3 + 1;
          }
          uVar7 = uStack_10210;
          if (uStack_10218 == 0x331) {
            if ((int)uVar9 < 0x32) {
              if (0 < (int)uVar9) {
                uVar5 = 0;
                do {
                  if (uVar7 == auStack_101c8[uVar5 * 2]) {
                    if (diags != 0) {
                      fprintf(_stderr,"Duplicate tag: %ld\n",uVar7);
                    }
                    if (iVar6 == 0) {
                      iVar6 = -0x35;
                    }
                  }
                  uVar5 = uVar5 + 1;
                } while (uVar9 != uVar5);
              }
              auStack_101c8[(long)(int)uVar9 * 2] = (uint)uVar7;
              auStack_101c8[(long)(int)uVar9 * 2 + 1] = s->instrs;
              uVar9 = uVar9 + 1;
              script = pcStack_10220;
            }
            else {
              if (diags != 0) {
                fprintf(_stderr,"Too many tags: %ld\n",uStack_10210);
              }
              if (iVar6 == 0) {
                iVar6 = -0x36;
              }
            }
          }
          else {
            pcVar1 = s->instr;
            iVar2 = s->instrs;
            s->instrs = iVar2 + 1;
            pcVar1[iVar2].p[0] = uStack_10218;
            pcVar1[iVar2].p[1] = uStack_10210;
            pcVar1[iVar2].p[2] = uStack_10208;
            (pcVar1[iVar2].p + 2)[1] = sStack_10200;
            pcVar1[iVar2].p[4] = (uintptr_t)pcStack_101f8;
            *&pcVar1[iVar2].opt = cStack_10228.opt;
          }
        }
      } while (cStack_10228.eaten < iVar8);
      iVar8 = s->instrs;
      if (0 < iVar8) {
        lVar10 = 0;
        do {
          pcVar1 = s->instr;
          if ((pcVar1[lVar10].p[0] - 0x32c < 5) || (pcVar1[lVar10].p[0] == 0x322)) {
            if (0 < (int)uVar9) {
              uVar7 = 0;
              do {
                if (pcVar1[lVar10].p[1] == (ulong)auStack_101c8[uVar7 * 2]) {
                  pcVar1[lVar10].p[1] = (long)(int)auStack_101c8[uVar7 * 2 + 1];
                  goto LAB_0012712b;
                }
                uVar7 = uVar7 + 1;
              } while (uVar9 != uVar7);
            }
            if (diags != 0) {
              fprintf(_stderr,"Can\'t resolve tag %ld\n");
              iVar8 = s->instrs;
            }
            if (iVar6 == 0) {
              iVar6 = -0x3f;
            }
          }
LAB_0012712b:
          lVar10 = lVar10 + 1;
        } while (lVar10 < iVar8);
      }
    }
  }
  return iVar6;
}

Assistant:

int cmdParseScript(char *script, cmdScript_t *s, int diags)
{
   int idx, len, b, i, j, tags, resolved;
   int status;
   uintptr_t p[10];
   cmdInstr_t instr;
   cmdCtlParse_t ctl;
   char v[CMD_MAX_EXTENSION];

   ctl.eaten = 0;

   status = 0;

   cmdTagStep_t tag_step[PI_MAX_SCRIPT_TAGS];

   len = strlen(script);

   /* calloc space for PARAMS, VARS, CMDS, and STRINGS */

   b = (sizeof(int) * (PI_MAX_SCRIPT_PARAMS + PI_MAX_SCRIPT_VARS)) +
       (sizeof(cmdInstr_t) * (len + 2) / 2) + len;

   s->par = calloc(1, b);

   if (s->par == NULL) return -1;

   s->var = s->par + PI_MAX_SCRIPT_PARAMS;

   s->instr = (cmdInstr_t *)(s->var + PI_MAX_SCRIPT_VARS);

   s->str_area = (char *)(s->instr + ((len + 2) / 2));

   s->str_area_len = len;
   s->str_area_pos = 0;

   s->instrs = 0;

   tags = 0;

   idx = 0;

   while (ctl.eaten<len)
   {
      idx = cmdParse(script, p, CMD_MAX_EXTENSION, v, &ctl);

      /* abort if command is illegal in a script */

      if ((idx >= 0) || (idx != CMD_UNKNOWN_CMD))
      {
         if (!cmdInfo[intCmdIdx].cvis) idx = CMD_NOT_IN_SCRIPT;
      }

      if (idx >= 0)
      {
         if (p[3])
         {
            memcpy(s->str_area + s->str_area_pos, v, p[3]);
            s->str_area[s->str_area_pos + p[3]] = 0;
            p[4] = (intptr_t) s->str_area + s->str_area_pos;
            s->str_area_pos += (p[3] + 1);
         }

         memcpy(&instr.p, p, sizeof(instr.p));

         if (instr.p[0] == PI_CMD_TAG)
         {
            if (tags < PI_MAX_SCRIPT_TAGS)
            {
               /* check tag not already used */
               for (j=0; j<tags; j++)
               {
                  if (tag_step[j].tag == instr.p[1])
                  {
                     if (diags)
                     {
                        fprintf(stderr, "Duplicate tag: %"PRIdPTR"\n", instr.p[1]);
                     }

                     if (!status) status = PI_DUP_TAG;
                     idx = -1;
                  }
               }

               tag_step[tags].tag = instr.p[1];
               tag_step[tags].step = s->instrs;
               tags++;
            }
            else
            {
               if (diags)
               {
                  fprintf(stderr, "Too many tags: %"PRIdPTR"\n", instr.p[1]);
               }
               if (!status) status = PI_TOO_MANY_TAGS;
               idx = -1;
            }
         }
      }
      else
      {
         if (diags)
         {
            if (idx == CMD_UNKNOWN_CMD)
               fprintf(stderr, "Unknown command: %s\n", cmdStr());
            else if (idx == CMD_NOT_IN_SCRIPT)
               fprintf(stderr, "Command illegal in script: %s\n", cmdStr());
            else
               fprintf(stderr, "Bad parameter to %s\n", cmdStr());
         }
         if (!status) status = PI_BAD_SCRIPT_CMD;
      }

      if (idx >= 0)
      {
         if (instr.p[0] != PI_CMD_TAG)
         {
            memcpy(instr.opt, &ctl.opt, sizeof(instr.opt));
            s->instr[s->instrs++] = instr;
         }
      }
   }

   for (i=0; i<s->instrs; i++)
   {
      instr = s->instr[i];

      /* resolve jumps */

      if ((instr.p[0] == PI_CMD_JMP) || (instr.p[0] == PI_CMD_CALL) ||
          (instr.p[0] == PI_CMD_JZ)  || (instr.p[0] == PI_CMD_JNZ)  ||
          (instr.p[0] == PI_CMD_JM)  || (instr.p[0] == PI_CMD_JP))
      {
         resolved = 0;

         for (j=0; j<tags; j++)
         {
            if (instr.p[1] == tag_step[j].tag)
            {
               s->instr[i].p[1] = tag_step[j].step;
               resolved = 1;
               break;
            }
         }

         if (!resolved)
         {
            if (diags)
            {
               fprintf(stderr, "Can't resolve tag %"PRIdPTR"\n", instr.p[1]);
            }
            if (!status) status = PI_BAD_TAG;
         }
      }
   }
   return status;
}